

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O2

void free_rule(ip_rule_t *ipr)

{
  list_head *plVar1;
  list_head *plVar2;
  ip_target_t *p;
  list_head *plVar3;
  
  if (ipr != (ip_rule_t *)0x0) {
    plVar3 = (ipr->list).next;
    plVar1 = (ipr->list).prev;
    plVar3->prev = plVar1;
    plVar1->next = plVar3;
    (ipr->list).next = (list_head *)0x0;
    (ipr->list).prev = (list_head *)0x0;
    plVar3 = (ipr->matchs).next;
    while (plVar3 != &ipr->matchs) {
      plVar1 = plVar3->next;
      plVar2 = plVar3->prev;
      plVar1->prev = plVar2;
      plVar2->next = plVar1;
      plVar3->next = (list_head *)0x0;
      plVar3->prev = (list_head *)0x0;
      if (plVar3[-1].prev != (list_head *)0x0) {
        mwFree(plVar3[-1].prev,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
               0x3e);
        plVar3[-1].prev = (list_head *)0x0;
      }
      mwFree(plVar3 + -1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",0x3f)
      ;
      plVar3 = plVar1;
    }
    p = ipr->target_ext;
    if (p != (ip_target_t *)0x0) {
      if (p->data != (void *)0x0) {
        mwFree(p->data,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
               0x51);
        p = ipr->target_ext;
        p->data = (void *)0x0;
      }
      mwFree(p,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
             0x52);
      ipr->target_ext = (ip_target_t *)0x0;
    }
    mwFree(ipr,"/workspace/llm4binary/github/license_all_cmakelists_25/Freeind[P]ita/iptables.c",
           0x55);
    return;
  }
  return;
}

Assistant:

static void free_rule(ip_rule_t *ipr)
{
	if (ipr == NULL) {
		return;
	}

	list_del(&ipr->list);

	ip_match_t *p = NULL, *q = NULL;

	list_for_each_entry_safe(p, q, &ipr->matchs, list) {
		free_match(p);
	}

	if (ipr->target_ext) {
		_free(ipr->target_ext->data);
		_free(ipr->target_ext);
	}

	_free(ipr);
}